

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31cSampleShadingTests.cpp
# Opt level: O0

IterateResult __thiscall glcts::SampleShadingRenderCase::iterate(SampleShadingRenderCase *this)

{
  void **ppvVar1;
  allocator<tcu::Vector<float,_4>_> *this_00;
  int iVar2;
  uint uVar3;
  uint uVar4;
  uint uVar5;
  TestContext *this_01;
  code *pcVar6;
  code *pcVar7;
  bool bVar8;
  int iVar9;
  deUint32 dVar10;
  undefined4 uVar11;
  int iVar12;
  RenderContext *pRVar13;
  undefined4 extraout_var;
  ContextInfo *pCVar14;
  ulong uVar15;
  char *pcVar16;
  TestError *pTVar17;
  TextureFormat *pTVar18;
  reference pvVar19;
  size_type sVar20;
  reference pvVar21;
  reference pvVar22;
  char *local_b90;
  VertexArrayBinding *local_a40;
  VertexArrayBinding *local_920;
  undefined8 uStack_840;
  int expectedUnique;
  undefined8 local_838;
  uint local_830;
  allocator<unsigned_int> local_829;
  uint i_1;
  vector<unsigned_int,_std::allocator<unsigned_int>_> data_1;
  undefined8 local_808;
  uint local_800;
  allocator<int> local_7f9;
  uint i;
  vector<int,_std::allocator<int>_> data;
  int uniquePixels;
  vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_> result;
  PixelBufferAccess pixels;
  TextureLevel results;
  allocator<char> local_751;
  string local_750;
  undefined1 *local_730;
  undefined1 local_728 [8];
  VertexArrayBinding vertexArrays_1 [1];
  float position_1 [8];
  string local_6b0;
  string local_690;
  string local_670;
  allocator<char> local_64a;
  allocator<char> local_649;
  string local_648;
  string local_628;
  string local_608;
  ProgramSources local_5e8;
  undefined1 local_518 [8];
  ShaderProgram program_1;
  undefined4 local_440;
  GLuint fbo;
  GLuint rbo;
  GLsizei width;
  undefined1 local_41a;
  allocator<char> local_419;
  string local_418;
  allocator<char> local_3f1;
  string local_3f0;
  void **local_3d0;
  undefined1 local_3c8 [8];
  VertexArrayBinding vertexArrays [2];
  float color [16];
  float position [8];
  allocator<char> local_2ba;
  allocator<char> local_2b9;
  string local_2b8;
  string local_298;
  string local_278;
  allocator<char> local_255 [20];
  allocator<char> local_241;
  string local_240;
  string local_220;
  string local_200;
  ProgramSources local_1e0;
  undefined1 local_110 [8];
  ShaderProgram program;
  undefined4 local_38;
  GLuint fboMs;
  GLuint tex;
  GLint samples;
  GLint maxSamples;
  bool isOk;
  Functions *gl;
  TestLog *log;
  SampleShadingRenderCase *this_local;
  
  log = (TestLog *)this;
  gl = (Functions *)
       tcu::TestContext::getLog((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx);
  pRVar13 = deqp::Context::getRenderContext((this->super_TestCase).m_context);
  iVar9 = (*pRVar13->_vptr_RenderContext[3])();
  _maxSamples = CONCAT44(extraout_var,iVar9);
  samples._3_1_ = 1;
  if (this->m_glslVersion == GLSL_VERSION_310_ES) {
    pCVar14 = deqp::Context::getContextInfo((this->super_TestCase).m_context);
    bVar8 = glu::ContextInfo::isExtensionSupported(pCVar14,"GL_OES_sample_shading");
    if (!bVar8) {
      tcu::TestContext::setTestResult
                ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx,
                 QP_TEST_RESULT_NOT_SUPPORTED,"GL_OES_sample_shading");
      return STOP;
    }
  }
  uVar15 = std::__cxx11::string::empty();
  if ((uVar15 & 1) == 0) {
    pCVar14 = deqp::Context::getContextInfo((this->super_TestCase).m_context);
    pcVar16 = (char *)std::__cxx11::string::c_str();
    bVar8 = glu::ContextInfo::isExtensionSupported(pCVar14,pcVar16);
    if (!bVar8) {
      this_01 = (this->super_TestCase).super_TestCase.super_TestNode.m_testCtx;
      pcVar16 = (char *)std::__cxx11::string::c_str();
      tcu::TestContext::setTestResult(this_01,QP_TEST_RESULT_NOT_SUPPORTED,pcVar16);
      return STOP;
    }
  }
  this->m_pGLMinSampleShading = *(glMinSampleShadingFunc *)(_maxSamples + 0xdc8);
  tex = 0;
  if ((((((this->m_texFormat).type == FLOAT) && ((this->m_texFormat).order == RGBA)) ||
       (((this->m_texFormat).type == FLOAT && ((this->m_texFormat).order == RG)))) ||
      (((this->m_texFormat).type == FLOAT && ((this->m_texFormat).order == R)))) ||
     (((this->m_texFormat).type == HALF_FLOAT && ((this->m_texFormat).order == RGBA)))) {
    (**(code **)(_maxSamples + 0x880))(0x9100,this->m_internalFormat,0x80a9,1,&tex);
    if (tex == 0) {
      tcu::TestContext::setTestResult
                ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx,
                 QP_TEST_RESULT_NOT_SUPPORTED,"Multisample is not supported on this format");
      return STOP;
    }
  }
  else if (((this->m_texFormat).type == SIGNED_INT8) || ((this->m_texFormat).type == UNSIGNED_INT8))
  {
    (**(code **)(_maxSamples + 0x868))(0x9110,&tex);
  }
  else {
    (**(code **)(_maxSamples + 0x868))(0x8d57,&tex);
  }
  fboMs = de::min<int>(tex,4);
  (**(code **)(_maxSamples + 0x6f8))(1,&local_38);
  (**(code **)(_maxSamples + 0xb8))(0x9100,local_38);
  (**(code **)(_maxSamples + 0x1390))(0x9100,fboMs,this->m_internalFormat,0x10);
  (**(code **)(_maxSamples + 0x6d0))
            (1,(undefined1 *)((long)&program.m_program.m_info.linkTimeUs + 4));
  (**(code **)(_maxSamples + 0x78))(0x8d40,program.m_program.m_info.linkTimeUs._4_4_);
  (**(code **)(_maxSamples + 0x6a0))(0x8d40,0x8ce0,0x9100,local_38,0);
  (**(code **)(_maxSamples + 0x1a00))(0,0,0x10);
  (*this->m_pGLMinSampleShading)(this->m_sampleShading);
  (**(code **)(_maxSamples + 0x5e0))(0x8c36);
  pRVar13 = deqp::Context::getRenderContext((this->super_TestCase).m_context);
  pcVar16 = iterate::vss;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_240,pcVar16,&local_241);
  specializeVersion(&local_220,&local_240,this->m_glslVersion,&this->m_sampler,&this->m_outType);
  pcVar16 = (char *)std::__cxx11::string::c_str();
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_200,pcVar16,local_255);
  pcVar16 = iterate::fss;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_2b8,pcVar16,&local_2b9);
  specializeVersion(&local_298,&local_2b8,this->m_glslVersion,&this->m_sampler,&this->m_outType);
  pcVar16 = (char *)std::__cxx11::string::c_str();
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_278,pcVar16,&local_2ba);
  glu::makeVtxFragSources(&local_1e0,&local_200,&local_278);
  glu::ShaderProgram::ShaderProgram((ShaderProgram *)local_110,pRVar13,&local_1e0);
  glu::ProgramSources::~ProgramSources(&local_1e0);
  std::__cxx11::string::~string((string *)&local_278);
  std::allocator<char>::~allocator(&local_2ba);
  std::__cxx11::string::~string((string *)&local_298);
  std::__cxx11::string::~string((string *)&local_2b8);
  std::allocator<char>::~allocator(&local_2b9);
  std::__cxx11::string::~string((string *)&local_200);
  std::allocator<char>::~allocator(local_255);
  std::__cxx11::string::~string((string *)&local_220);
  std::__cxx11::string::~string((string *)&local_240);
  std::allocator<char>::~allocator(&local_241);
  glu::operator<<((TestLog *)gl,(ShaderProgram *)local_110);
  bVar8 = glu::ShaderProgram::isOk((ShaderProgram *)local_110);
  if (bVar8) {
    color[0xe] = -1.0;
    color[0xf] = -1.0;
    vertexArrays[1].pointer.data._0_4_ = this->m_min;
    vertexArrays[1].pointer.data._4_4_ = this->m_min;
    color[0] = 0.0;
    color[1] = 1.0;
    color[2] = this->m_min;
    color[3] = this->m_max;
    color[4] = 0.0;
    color[5] = 1.0;
    color[6] = this->m_max;
    color[7] = this->m_min;
    color[8] = 0.0;
    color[9] = 1.0;
    color[10] = this->m_max;
    color[0xb] = this->m_max;
    color[0xc] = 0.0;
    color[0xd] = 1.0;
    pcVar6 = *(code **)(_maxSamples + 0x1680);
    dVar10 = glu::ShaderProgram::getProgram((ShaderProgram *)local_110);
    (*pcVar6)(dVar10);
    local_41a = 1;
    local_3d0 = (void **)local_3c8;
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_3f0,"a_position",&local_3f1)
    ;
    glu::va::Float((VertexArrayBinding *)local_3c8,&local_3f0,2,4,0,color + 0xe);
    ppvVar1 = &vertexArrays[0].pointer.data;
    local_3d0 = ppvVar1;
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_418,"a_color",&local_419);
    glu::va::Float((VertexArrayBinding *)ppvVar1,&local_418,4,4,0,
                   (float *)&vertexArrays[1].pointer.data);
    local_41a = 0;
    std::__cxx11::string::~string((string *)&local_418);
    std::allocator<char>::~allocator(&local_419);
    std::__cxx11::string::~string((string *)&local_3f0);
    std::allocator<char>::~allocator(&local_3f1);
    pRVar13 = deqp::Context::getRenderContext((this->super_TestCase).m_context);
    dVar10 = glu::ShaderProgram::getProgram((ShaderProgram *)local_110);
    glu::pr::TriangleStrip((PrimitiveList *)&rbo,6,iterate::quadIndices);
    glu::draw(pRVar13,dVar10,2,(VertexArrayBinding *)local_3c8,(PrimitiveList *)&rbo,
              (DrawUtilCallback *)0x0);
    dVar10 = (**(code **)(_maxSamples + 0x800))();
    glu::checkError(dVar10,"Draw quad",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gles31/es31cSampleShadingTests.cpp"
                    ,0x147);
    local_920 = (VertexArrayBinding *)&vertexArrays[1].pointer.data;
    do {
      local_920 = local_920 + -1;
      glu::VertexArrayBinding::~VertexArrayBinding(local_920);
    } while (local_920 != (VertexArrayBinding *)local_3c8);
    glu::ShaderProgram::~ShaderProgram((ShaderProgram *)local_110);
    (*this->m_pGLMinSampleShading)(0.0);
    (**(code **)(_maxSamples + 0x4e8))(0x8c36);
    pcVar6 = *(code **)(_maxSamples + 0x78);
    pRVar13 = deqp::Context::getRenderContext((this->super_TestCase).m_context);
    iVar9 = (*pRVar13->_vptr_RenderContext[6])();
    (*pcVar6)(0x8d40,iVar9);
    (**(code **)(_maxSamples + 0x440))
              (1,(undefined1 *)((long)&program.m_program.m_info.linkTimeUs + 4));
    fbo = fboMs << 4;
    (**(code **)(_maxSamples + 0x6e8))(1,&local_440);
    (**(code **)(_maxSamples + 0xa0))(0x8d41,local_440);
    (**(code **)(_maxSamples + 0x1238))(0x8d41,this->m_internalFormat,fbo);
    (**(code **)(_maxSamples + 0x6d0))
              (1,(undefined1 *)((long)&program_1.m_program.m_info.linkTimeUs + 4));
    (**(code **)(_maxSamples + 0x78))(0x8d40,program_1.m_program.m_info.linkTimeUs._4_4_);
    (**(code **)(_maxSamples + 0x688))(0x8d40,0x8ce0,0x8d41,local_440);
    (**(code **)(_maxSamples + 0x1a00))(0,0,fbo,0x10);
    pRVar13 = deqp::Context::getRenderContext((this->super_TestCase).m_context);
    pcVar16 = iterate()::vss;
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_648,pcVar16,&local_649);
    specializeVersion(&local_628,&local_648,this->m_glslVersion,&this->m_sampler,&this->m_outType);
    pcVar16 = (char *)std::__cxx11::string::c_str();
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_608,pcVar16,&local_64a);
    pcVar16 = iterate()::fss;
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_6b0,pcVar16,(allocator<char> *)((long)position_1 + 0x1f));
    specializeVersion(&local_690,&local_6b0,this->m_glslVersion,&this->m_sampler,&this->m_outType);
    pcVar16 = (char *)std::__cxx11::string::c_str();
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_670,pcVar16,(allocator<char> *)((long)position_1 + 0x1e));
    glu::makeVtxFragSources(&local_5e8,&local_608,&local_670);
    glu::ShaderProgram::ShaderProgram((ShaderProgram *)local_518,pRVar13,&local_5e8);
    glu::ProgramSources::~ProgramSources(&local_5e8);
    std::__cxx11::string::~string((string *)&local_670);
    std::allocator<char>::~allocator((allocator<char> *)((long)position_1 + 0x1e));
    std::__cxx11::string::~string((string *)&local_690);
    std::__cxx11::string::~string((string *)&local_6b0);
    std::allocator<char>::~allocator((allocator<char> *)((long)position_1 + 0x1f));
    std::__cxx11::string::~string((string *)&local_608);
    std::allocator<char>::~allocator(&local_64a);
    std::__cxx11::string::~string((string *)&local_628);
    std::__cxx11::string::~string((string *)&local_648);
    std::allocator<char>::~allocator(&local_649);
    glu::operator<<((TestLog *)gl,(ShaderProgram *)local_518);
    bVar8 = glu::ShaderProgram::isOk((ShaderProgram *)local_518);
    if (bVar8) {
      position_1[2] = 1.0;
      position_1[3] = -1.0;
      position_1[4] = 1.0;
      position_1[5] = 1.0;
      vertexArrays_1[0].pointer.data = (void *)0xbf800000bf800000;
      position_1[0] = -1.0;
      position_1[1] = 1.0;
      pcVar6 = *(code **)(_maxSamples + 0x1680);
      dVar10 = glu::ShaderProgram::getProgram((ShaderProgram *)local_518);
      (*pcVar6)(dVar10);
      pcVar6 = *(code **)(_maxSamples + 0x14f0);
      pcVar7 = *(code **)(_maxSamples + 0xb48);
      dVar10 = glu::ShaderProgram::getProgram((ShaderProgram *)local_518);
      uVar11 = (*pcVar7)(dVar10,"u_samples");
      (*pcVar6)(uVar11,fboMs);
      pcVar6 = *(code **)(_maxSamples + 0x14f0);
      pcVar7 = *(code **)(_maxSamples + 0xb48);
      dVar10 = glu::ShaderProgram::getProgram((ShaderProgram *)local_518);
      uVar11 = (*pcVar7)(dVar10,"u_tex");
      (*pcVar6)(uVar11,0);
      local_730 = local_728;
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_750,"a_position",&local_751);
      glu::va::Float((VertexArrayBinding *)local_728,&local_750,2,4,0,
                     (float *)&vertexArrays_1[0].pointer.data);
      std::__cxx11::string::~string((string *)&local_750);
      std::allocator<char>::~allocator(&local_751);
      pRVar13 = deqp::Context::getRenderContext((this->super_TestCase).m_context);
      dVar10 = glu::ShaderProgram::getProgram((ShaderProgram *)local_518);
      glu::pr::TriangleStrip((PrimitiveList *)&results.m_data.m_cap,6,iterate::quadIndices);
      glu::draw(pRVar13,dVar10,1,(VertexArrayBinding *)local_728,
                (PrimitiveList *)&results.m_data.m_cap,(DrawUtilCallback *)0x0);
      dVar10 = (**(code **)(_maxSamples + 0x800))();
      glu::checkError(dVar10,"Draw quad",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gles31/es31cSampleShadingTests.cpp"
                      ,0x186);
      local_a40 = (VertexArrayBinding *)&vertexArrays_1[0].pointer.data;
      do {
        local_a40 = local_a40 + -1;
        glu::VertexArrayBinding::~VertexArrayBinding(local_a40);
      } while (local_a40 != (VertexArrayBinding *)local_728);
      glu::ShaderProgram::~ShaderProgram((ShaderProgram *)local_518);
      ppvVar1 = &pixels.super_ConstPixelBufferAccess.m_data;
      tcu::TextureLevel::TextureLevel((TextureLevel *)ppvVar1,&this->m_texFormat,fbo,0x10,1);
      tcu::TextureLevel::getAccess
                ((PixelBufferAccess *)
                 &result.
                  super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>
                  ._M_impl.super__Vector_impl_data._M_end_of_storage,(TextureLevel *)ppvVar1);
      iVar9 = tcu::ConstPixelBufferAccess::getHeight
                        ((ConstPixelBufferAccess *)
                         &result.
                          super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage);
      iVar12 = tcu::ConstPixelBufferAccess::getWidth
                         ((ConstPixelBufferAccess *)
                          &result.
                           super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>
                           ._M_impl.super__Vector_impl_data._M_end_of_storage);
      this_00 = (allocator<tcu::Vector<float,_4>_> *)
                ((long)&data.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                        super__Vector_impl_data._M_end_of_storage + 7);
      std::allocator<tcu::Vector<float,_4>_>::allocator(this_00);
      std::vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>::vector
                ((vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_> *)
                 &uniquePixels,(long)(iVar9 * iVar12),this_00);
      std::allocator<tcu::Vector<float,_4>_>::~allocator
                ((allocator<tcu::Vector<float,_4>_> *)
                 ((long)&data.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                         super__Vector_impl_data._M_end_of_storage + 7));
      pTVar18 = tcu::ConstPixelBufferAccess::getFormat
                          ((ConstPixelBufferAccess *)
                           &result.
                            super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>
                            ._M_impl.super__Vector_impl_data._M_end_of_storage);
      if (pTVar18->type == SIGNED_INT8) {
        iVar9 = tcu::ConstPixelBufferAccess::getHeight
                          ((ConstPixelBufferAccess *)
                           &result.
                            super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>
                            ._M_impl.super__Vector_impl_data._M_end_of_storage);
        iVar12 = tcu::ConstPixelBufferAccess::getWidth
                           ((ConstPixelBufferAccess *)
                            &result.
                             super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>
                             ._M_impl.super__Vector_impl_data._M_end_of_storage);
        std::allocator<int>::allocator(&local_7f9);
        std::vector<int,_std::allocator<int>_>::vector
                  ((vector<int,_std::allocator<int>_> *)&i,(long)(iVar9 * iVar12 * 4),&local_7f9);
        std::allocator<int>::~allocator(&local_7f9);
        pcVar6 = *(code **)(_maxSamples + 0x1220);
        iVar9 = tcu::ConstPixelBufferAccess::getWidth
                          ((ConstPixelBufferAccess *)
                           &result.
                            super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>
                            ._M_impl.super__Vector_impl_data._M_end_of_storage);
        iVar12 = tcu::ConstPixelBufferAccess::getHeight
                           ((ConstPixelBufferAccess *)
                            &result.
                             super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>
                             ._M_impl.super__Vector_impl_data._M_end_of_storage);
        pvVar19 = std::vector<int,_std::allocator<int>_>::operator[]
                            ((vector<int,_std::allocator<int>_> *)&i,0);
        (*pcVar6)(0,0,iVar9,iVar12,0x8d99,0x1404,pvVar19);
        for (local_800 = 0;
            sVar20 = std::vector<int,_std::allocator<int>_>::size
                               ((vector<int,_std::allocator<int>_> *)&i), local_800 < sVar20;
            local_800 = local_800 + 4) {
          pvVar19 = std::vector<int,_std::allocator<int>_>::operator[]
                              ((vector<int,_std::allocator<int>_> *)&i,(ulong)local_800);
          iVar9 = *pvVar19;
          pvVar19 = std::vector<int,_std::allocator<int>_>::operator[]
                              ((vector<int,_std::allocator<int>_> *)&i,(ulong)(local_800 + 1));
          iVar12 = *pvVar19;
          pvVar19 = std::vector<int,_std::allocator<int>_>::operator[]
                              ((vector<int,_std::allocator<int>_> *)&i,(ulong)(local_800 + 2));
          iVar2 = *pvVar19;
          pvVar19 = std::vector<int,_std::allocator<int>_>::operator[]
                              ((vector<int,_std::allocator<int>_> *)&i,(ulong)(local_800 + 3));
          tcu::Vector<float,_4>::Vector
                    ((Vector<float,_4> *)
                     &data_1.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl
                      .super__Vector_impl_data._M_end_of_storage,(float)iVar9,(float)iVar12,
                     (float)iVar2,(float)*pvVar19);
          pvVar21 = std::vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>::
                    operator[]((vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>
                                *)&uniquePixels,(ulong)(local_800 >> 2));
          *(pointer *)pvVar21->m_data =
               data_1.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
               super__Vector_impl_data._M_end_of_storage;
          *(undefined8 *)(pvVar21->m_data + 2) = local_808;
        }
        data.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
        _M_end_of_storage._0_4_ =
             countUniquePixels(this,(vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>
                                     *)&uniquePixels);
        std::vector<int,_std::allocator<int>_>::~vector((vector<int,_std::allocator<int>_> *)&i);
      }
      else {
        pTVar18 = tcu::ConstPixelBufferAccess::getFormat
                            ((ConstPixelBufferAccess *)
                             &result.
                              super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>
                              ._M_impl.super__Vector_impl_data._M_end_of_storage);
        if (pTVar18->type == UNSIGNED_INT8) {
          iVar9 = tcu::ConstPixelBufferAccess::getHeight
                            ((ConstPixelBufferAccess *)
                             &result.
                              super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>
                              ._M_impl.super__Vector_impl_data._M_end_of_storage);
          iVar12 = tcu::ConstPixelBufferAccess::getWidth
                             ((ConstPixelBufferAccess *)
                              &result.
                               super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>
                               ._M_impl.super__Vector_impl_data._M_end_of_storage);
          std::allocator<unsigned_int>::allocator(&local_829);
          std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
                    ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)&i_1,
                     (long)(iVar9 * iVar12 * 4),&local_829);
          std::allocator<unsigned_int>::~allocator(&local_829);
          pcVar6 = *(code **)(_maxSamples + 0x1220);
          iVar9 = tcu::ConstPixelBufferAccess::getWidth
                            ((ConstPixelBufferAccess *)
                             &result.
                              super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>
                              ._M_impl.super__Vector_impl_data._M_end_of_storage);
          iVar12 = tcu::ConstPixelBufferAccess::getHeight
                             ((ConstPixelBufferAccess *)
                              &result.
                               super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>
                               ._M_impl.super__Vector_impl_data._M_end_of_storage);
          pvVar22 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[]
                              ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)&i_1,0);
          (*pcVar6)(0,0,iVar9,iVar12,0x8d99,0x1405,pvVar22);
          for (local_830 = 0; uVar15 = (ulong)local_830,
              sVar20 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::size
                                 ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)&i_1),
              uVar15 < sVar20; local_830 = local_830 + 4) {
            pvVar22 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[]
                                ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)&i_1,
                                 (ulong)local_830);
            uVar3 = *pvVar22;
            pvVar22 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[]
                                ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)&i_1,
                                 (ulong)(local_830 + 1));
            uVar4 = *pvVar22;
            pvVar22 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[]
                                ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)&i_1,
                                 (ulong)(local_830 + 2));
            uVar5 = *pvVar22;
            pvVar22 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[]
                                ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)&i_1,
                                 (ulong)(local_830 + 3));
            tcu::Vector<float,_4>::Vector
                      ((Vector<float,_4> *)&stack0xfffffffffffff7c0,(float)uVar3,(float)uVar4,
                       (float)uVar5,(float)*pvVar22);
            pvVar21 = std::vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>::
                      operator[]((vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>
                                  *)&uniquePixels,(ulong)(local_830 >> 2));
            *(undefined8 *)pvVar21->m_data = uStack_840;
            *(undefined8 *)(pvVar21->m_data + 2) = local_838;
          }
          data.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
          _M_end_of_storage._0_4_ =
               countUniquePixels(this,(vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>
                                       *)&uniquePixels);
          std::vector<unsigned_int,_std::allocator<unsigned_int>_>::~vector
                    ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)&i_1);
        }
        else {
          pRVar13 = deqp::Context::getRenderContext((this->super_TestCase).m_context);
          glu::readPixels(pRVar13,0,0,
                          (PixelBufferAccess *)
                          &result.
                           super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>
                           ._M_impl.super__Vector_impl_data._M_end_of_storage);
          data.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
          _M_end_of_storage._0_4_ =
               countUniquePixels(this,(ConstPixelBufferAccess *)
                                      &result.
                                       super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>
                                       ._M_impl.super__Vector_impl_data._M_end_of_storage);
        }
      }
      iVar9 = de::clamp<int>((int)((float)(int)fboMs * this->m_sampleShading),1,fboMs);
      if ((int)data.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
               _M_end_of_storage < iVar9 << 8) {
        samples._3_1_ = 0;
      }
      pcVar6 = *(code **)(_maxSamples + 0x78);
      pRVar13 = deqp::Context::getRenderContext((this->super_TestCase).m_context);
      iVar9 = (*pRVar13->_vptr_RenderContext[6])();
      (*pcVar6)(0x8d40,iVar9);
      (**(code **)(_maxSamples + 0x440))
                (1,(undefined1 *)((long)&program_1.m_program.m_info.linkTimeUs + 4));
      (**(code **)(_maxSamples + 0xa0))(0x8d41,0);
      (**(code **)(_maxSamples + 0x460))(1,&local_440);
      (**(code **)(_maxSamples + 0xb8))(0x9100,0);
      (**(code **)(_maxSamples + 0x480))(1,&local_38);
      if ((samples._3_1_ & 1) == 0) {
        local_b90 = "Fail";
      }
      else {
        local_b90 = "Pass";
      }
      tcu::TestContext::setTestResult
                ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx,
                 (uint)((samples._3_1_ & 1) == 0),local_b90);
      this_local._4_4_ = STOP;
      std::vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>::~vector
                ((vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_> *)
                 &uniquePixels);
      tcu::TextureLevel::~TextureLevel((TextureLevel *)&pixels.super_ConstPixelBufferAccess.m_data);
      return this_local._4_4_;
    }
    pTVar17 = (TestError *)__cxa_allocate_exception(0x38);
    tcu::TestError::TestError
              (pTVar17,"Compile failed",(char *)0x0,
               "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gles31/es31cSampleShadingTests.cpp"
               ,0x175);
    __cxa_throw(pTVar17,&tcu::TestError::typeinfo,tcu::TestError::~TestError);
  }
  pTVar17 = (TestError *)__cxa_allocate_exception(0x38);
  tcu::TestError::TestError
            (pTVar17,"Compile failed",(char *)0x0,
             "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gles31/es31cSampleShadingTests.cpp"
             ,0x135);
  __cxa_throw(pTVar17,&tcu::TestError::typeinfo,tcu::TestError::~TestError);
}

Assistant:

SampleShadingRenderCase::IterateResult SampleShadingRenderCase::iterate()
{
	TestLog&			  log  = m_testCtx.getLog();
	const glw::Functions& gl   = m_context.getRenderContext().getFunctions();
	bool				  isOk = true;

	if (m_glslVersion == glu::GLSL_VERSION_310_ES &&
		!m_context.getContextInfo().isExtensionSupported("GL_OES_sample_shading"))
	{
		m_testCtx.setTestResult(QP_TEST_RESULT_NOT_SUPPORTED, "GL_OES_sample_shading");
		return STOP;
	}
	if (!m_extension.empty() && !m_context.getContextInfo().isExtensionSupported(m_extension.c_str()))
	{
		m_testCtx.setTestResult(QP_TEST_RESULT_NOT_SUPPORTED, m_extension.c_str());
		return STOP;
	}

	m_pGLMinSampleShading = gl.minSampleShading;

	GLint maxSamples = 0;
	if (((m_texFormat.type == tcu::TextureFormat::FLOAT) && (m_texFormat.order == tcu::TextureFormat::RGBA)) ||
		((m_texFormat.type == tcu::TextureFormat::FLOAT) && (m_texFormat.order == tcu::TextureFormat::RG)) ||
		((m_texFormat.type == tcu::TextureFormat::FLOAT) && (m_texFormat.order == tcu::TextureFormat::R)) ||
		((m_texFormat.type == tcu::TextureFormat::HALF_FLOAT) && (m_texFormat.order == tcu::TextureFormat::RGBA)))
	{
		gl.getInternalformativ(GL_TEXTURE_2D_MULTISAMPLE, m_internalFormat, GL_SAMPLES, 1, &maxSamples);
		if (maxSamples == 0)
		{
			m_testCtx.setTestResult(QP_TEST_RESULT_NOT_SUPPORTED, "Multisample is not supported on this format");
			return STOP;
		}
	}
	else if (m_texFormat.type == tcu::TextureFormat::SIGNED_INT8 ||
			 m_texFormat.type == tcu::TextureFormat::UNSIGNED_INT8)
	{
		gl.getIntegerv(GL_MAX_INTEGER_SAMPLES, &maxSamples);
	}
	else
	{
		gl.getIntegerv(GL_MAX_SAMPLES, &maxSamples);
	}
	GLint samples = de::min<GLint>(maxSamples, MAX_SAMPLES);

	GLuint tex;
	gl.genTextures(1, &tex);
	gl.bindTexture(GL_TEXTURE_2D_MULTISAMPLE, tex);
	gl.texStorage2DMultisample(GL_TEXTURE_2D_MULTISAMPLE, samples, m_internalFormat, WIDTH, HEIGHT, GL_FALSE);

	GLuint fboMs;
	gl.genFramebuffers(1, &fboMs);
	gl.bindFramebuffer(GL_FRAMEBUFFER, fboMs);
	gl.framebufferTexture2D(GL_FRAMEBUFFER, GL_COLOR_ATTACHMENT0, GL_TEXTURE_2D_MULTISAMPLE, tex, 0);
	gl.viewport(0, 0, WIDTH, HEIGHT);

	m_pGLMinSampleShading(m_sampleShading);
	gl.enable(GL_SAMPLE_SHADING_OES);

	static const deUint16 quadIndices[] = { 0, 1, 2, 2, 1, 3 };

	{
		static char const* vss = "${VERSION_DECL}\n"
								 "in highp vec2 a_position;\n"
								 "in highp vec4 a_color;\n"
								 "out highp vec4 v_color;\n"
								 "void main (void)\n"
								 "{\n"
								 "   gl_Position = vec4(a_position, 0.0, 1.0);\n"
								 "   v_color = a_color;\n"
								 "}\n";

		static char const* fss = "${VERSION_DECL}\n"
								 "in highp vec4 v_color;\n"
								 "layout(location = 0) out highp ${OUT_TYPE} o_color;\n"
								 "void main (void)\n"
								 "{\n"
								 "   o_color = ${OUT_TYPE}(v_color.x, v_color.y, 0.0, 0.0);\n"
								 "}\n";

		glu::ShaderProgram program(
			m_context.getRenderContext(),
			glu::makeVtxFragSources(specializeVersion(vss, m_glslVersion, m_sampler, m_outType).c_str(),
									specializeVersion(fss, m_glslVersion, m_sampler, m_outType).c_str()));
		log << program;
		if (!program.isOk())
		{
			TCU_FAIL("Compile failed");
		}

		const float position[] = {
			-1.0f, -1.0f, -1.0f, +1.0f, +1.0f, -1.0f, +1.0f, +1.0f,
		};
		const float color[] = {
			m_min, m_min, 0.0f, 1.0f, m_min, m_max, 0.0f, 1.0f, m_max, m_min, 0.0f, 1.0f, m_max, m_max, 0.0f, 1.0f,
		};

		gl.useProgram(program.getProgram());

		glu::VertexArrayBinding vertexArrays[] = {
			glu::va::Float("a_position", 2, 4, 0, &position[0]), glu::va::Float("a_color", 4, 4, 0, &color[0]),
		};
		glu::draw(m_context.getRenderContext(), program.getProgram(), DE_LENGTH_OF_ARRAY(vertexArrays),
				  &vertexArrays[0], glu::pr::TriangleStrip(DE_LENGTH_OF_ARRAY(quadIndices), &quadIndices[0]));

		GLU_EXPECT_NO_ERROR(gl.getError(), "Draw quad");
	}
	m_pGLMinSampleShading(0.0f);
	gl.disable(GL_SAMPLE_SHADING_OES);
	gl.bindFramebuffer(GL_FRAMEBUFFER, m_context.getRenderContext().getDefaultFramebuffer());
	gl.deleteFramebuffers(1, &fboMs);

	GLsizei width = WIDTH * samples;

	GLuint rbo;
	gl.genRenderbuffers(1, &rbo);
	gl.bindRenderbuffer(GL_RENDERBUFFER, rbo);
	gl.renderbufferStorage(GL_RENDERBUFFER, m_internalFormat, width, HEIGHT);

	GLuint fbo;
	gl.genFramebuffers(1, &fbo);
	gl.bindFramebuffer(GL_FRAMEBUFFER, fbo);
	gl.framebufferRenderbuffer(GL_FRAMEBUFFER, GL_COLOR_ATTACHMENT0, GL_RENDERBUFFER, rbo);
	gl.viewport(0, 0, width, HEIGHT);

	{
		static char const* vss = "${VERSION_DECL}\n"
								 "in highp vec2 a_position;\n"
								 "void main(void)\n"
								 "{\n"
								 "   gl_Position = vec4(a_position, 0.0, 1.0);\n"
								 "}\n";

		static char const* fss = "${VERSION_DECL}\n"
								 "uniform highp ${SAMPLER} u_tex;\n"
								 "uniform int u_samples;\n"
								 "layout(location = 0) out highp ${OUT_TYPE} o_color;\n"
								 "void main(void)\n"
								 "{\n"
								 "   ivec2 coord = ivec2(int(gl_FragCoord.x) / u_samples, gl_FragCoord.y);\n"
								 "   int sampleId = int(gl_FragCoord.x) % u_samples;\n"
								 "   o_color = texelFetch(u_tex, coord, sampleId);\n"
								 "}\n";

		glu::ShaderProgram program(
			m_context.getRenderContext(),
			glu::makeVtxFragSources(specializeVersion(vss, m_glslVersion, m_sampler, m_outType).c_str(),
									specializeVersion(fss, m_glslVersion, m_sampler, m_outType).c_str()));
		log << program;
		if (!program.isOk())
		{
			TCU_FAIL("Compile failed");
		}

		float const position[] = {
			-1.0f, -1.0f, -1.0f, +1.0f, +1.0f, -1.0f, +1.0f, +1.0f,
		};

		gl.useProgram(program.getProgram());
		gl.uniform1i(gl.getUniformLocation(program.getProgram(), "u_samples"), samples);
		gl.uniform1i(gl.getUniformLocation(program.getProgram(), "u_tex"), 0);

		glu::VertexArrayBinding vertexArrays[] = {
			glu::va::Float("a_position", 2, 4, 0, &position[0]),
		};
		glu::draw(m_context.getRenderContext(), program.getProgram(), DE_LENGTH_OF_ARRAY(vertexArrays),
				  &vertexArrays[0], glu::pr::TriangleStrip(DE_LENGTH_OF_ARRAY(quadIndices), &quadIndices[0]));

		GLU_EXPECT_NO_ERROR(gl.getError(), "Draw quad");
	}

	tcu::TextureLevel	  results(m_texFormat, width, HEIGHT);
	tcu::PixelBufferAccess pixels = results.getAccess();
	std::vector<tcu::Vec4> result(pixels.getHeight() * pixels.getWidth());
	int					   uniquePixels;

	if (pixels.getFormat().type == tcu::TextureFormat::SIGNED_INT8)
	{
		std::vector<GLint> data(pixels.getHeight() * pixels.getWidth() * 4);
		gl.readPixels(0, 0, pixels.getWidth(), pixels.getHeight(), GL_RGBA_INTEGER, GL_INT, &data[0]);
		for (unsigned int i = 0; i < data.size(); i += 4)
		{
			result[i / 4] =
				tcu::Vec4((GLfloat)data[i], (GLfloat)data[i + 1], (GLfloat)data[i + 2], (GLfloat)data[i + 3]);
		}
		uniquePixels = countUniquePixels(result);
	}
	else if (pixels.getFormat().type == tcu::TextureFormat::UNSIGNED_INT8)
	{
		std::vector<GLuint> data(pixels.getHeight() * pixels.getWidth() * 4);
		gl.readPixels(0, 0, pixels.getWidth(), pixels.getHeight(), GL_RGBA_INTEGER, GL_UNSIGNED_INT, &data[0]);
		for (unsigned int i = 0; i < data.size(); i += 4)
		{
			result[i / 4] =
				tcu::Vec4((GLfloat)data[i], (GLfloat)data[i + 1], (GLfloat)data[i + 2], (GLfloat)data[i + 3]);
		}
		uniquePixels = countUniquePixels(result);
	}
	else
	{
		glu::readPixels(m_context.getRenderContext(), 0, 0, pixels);
		uniquePixels = countUniquePixels(pixels);
	}
	int expectedUnique = WIDTH * HEIGHT * (de::clamp(int(float(samples) * m_sampleShading), 1, samples));
	if (uniquePixels < expectedUnique)
	{
		isOk = false;
	}

	gl.bindFramebuffer(GL_FRAMEBUFFER, m_context.getRenderContext().getDefaultFramebuffer());
	gl.deleteFramebuffers(1, &fbo);

	gl.bindRenderbuffer(GL_RENDERBUFFER, 0);
	gl.deleteRenderbuffers(1, &rbo);

	gl.bindTexture(GL_TEXTURE_2D_MULTISAMPLE, 0);
	gl.deleteTextures(1, &tex);

	m_testCtx.setTestResult(isOk ? QP_TEST_RESULT_PASS : QP_TEST_RESULT_FAIL, isOk ? "Pass" : "Fail");
	return STOP;
}